

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
luna::Exception::
SetWhat<char_const*&,char_const(&)[7],char_const*,char_const(&)[18],char_const*&,char_const(&)[7]>
          (Exception *this,ostringstream *oss,char **arg,char (*args) [7],char **args_1,
          char (*args_2) [18],char **args_3,char (*args_4) [7])

{
  Exception *in_RCX;
  undefined8 *in_RDX;
  ostream *in_RSI;
  char **in_RDI;
  ostringstream *in_R8;
  char (*in_R9) [7];
  char **in_stack_00000010;
  char (*in_stack_ffffffffffffffc0) [18];
  
  std::operator<<(in_RSI,(char *)*in_RDX);
  SetWhat<char_const(&)[7],char_const*,char_const(&)[18],char_const*&,char_const(&)[7]>
            (in_RCX,in_R8,in_R9,in_RDI,in_stack_ffffffffffffffc0,in_stack_00000010,
             (char (*) [7])in_RSI);
  return;
}

Assistant:

void SetWhat(std::ostringstream &oss, Arg&& arg, Args&&... args)
        {
            oss << std::forward<Arg>(arg);
            SetWhat(oss, std::forward<Args>(args)...);
        }